

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntFill(Vec_Int_t *p,int nSize,int Fill)

{
  int local_1c;
  int i;
  int Fill_local;
  int nSize_local;
  Vec_Int_t *p_local;
  
  Vec_IntGrow(p,nSize);
  for (local_1c = 0; local_1c < nSize; local_1c = local_1c + 1) {
    p->pArray[local_1c] = Fill;
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_IntFill( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    Vec_IntGrow( p, nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}